

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::Rotate(ParsedScene *this,Float angle,Float dx,Float dy,Float dz,FileLoc loc)

{
  Transform *pTVar1;
  long in_RDI;
  float in_XMM0_Da;
  int i;
  float in_stack_fffffffffffffeb8;
  Vector3f *axis;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TransformSet *in_stack_fffffffffffffef8;
  FileLoc *in_stack_ffffffffffffff00;
  Transform *in_stack_ffffffffffffff48;
  Transform *in_stack_ffffffffffffff50;
  undefined1 local_9c [128];
  int local_1c;
  float local_c;
  
  axis = (Vector3f *)&stack0x00000008;
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[7]>
              (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char (*) [7])CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  else {
    local_c = in_XMM0_Da;
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      if ((*(uint *)(in_RDI + 0x964) & 1 << ((byte)local_1c & 0x1f)) != 0) {
        pTVar1 = TransformSet::operator[](in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        Vector3<float>::Vector3((Vector3<float> *)pTVar1,local_c,in_stack_fffffffffffffeb8,0.0);
        pbrt::Rotate((Float)((ulong)in_RDI >> 0x20),axis);
        pbrt::Transform::operator*(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        pTVar1 = TransformSet::operator[](in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        memcpy(pTVar1,local_9c,0x80);
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::Rotate(Float angle, Float dx, Float dy, Float dz, FileLoc loc) {
    VERIFY_INITIALIZED("Rotate");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = curTransform[i] *
                                            pbrt::Rotate(angle, Vector3f(dx, dy, dz));)
}